

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O1

UVector * __thiscall
icu_63::ICUService::getVisibleIDs
          (ICUService *this,UVector *result,UnicodeString *matchID,UErrorCode *status)

{
  UnicodeString *that;
  char cVar1;
  int iVar2;
  Hashtable *pHVar3;
  undefined4 extraout_var;
  UHashElement *pUVar5;
  UnicodeString *pUVar6;
  int32_t pos;
  undefined4 local_34;
  long *plVar4;
  
  UVector::removeAllElements(result);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    umtx_lock_63((UMutex *)lock);
    pHVar3 = getVisibleIDMap(this,status);
    if (pHVar3 != (Hashtable *)0x0) {
      iVar2 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xd])(this,matchID,status);
      plVar4 = (long *)CONCAT44(extraout_var,iVar2);
      local_34 = 0xffffffff;
      do {
        pUVar6 = (UnicodeString *)&stack0xffffffffffffffcc;
        pUVar5 = uhash_nextElement_63(pHVar3->hash,(int32_t *)&stack0xffffffffffffffcc);
        iVar2 = 2;
        if (pUVar5 != (UHashElement *)0x0) {
          that = (UnicodeString *)(pUVar5->key).pointer;
          if (plVar4 != (long *)0x0) {
            pUVar6 = that;
            cVar1 = (**(code **)(*plVar4 + 0x40))(plVar4);
            if (cVar1 == '\0') {
              iVar2 = 3;
              goto LAB_0029ee24;
            }
          }
          pUVar6 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar6);
          if (pUVar6 == (UnicodeString *)0x0) {
            pUVar6 = (UnicodeString *)0x0;
          }
          else {
            UnicodeString::UnicodeString(pUVar6,that);
          }
          if (pUVar6 != (UnicodeString *)0x0) {
            if ((undefined1  [56])((undefined1  [56])pUVar6->fUnion & (undefined1  [56])0x1) ==
                (undefined1  [56])0x0) {
              UVector::addElement(result,pUVar6,status);
              if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                iVar2 = 0;
              }
              else {
                (*(pUVar6->super_Replaceable).super_UObject._vptr_UObject[1])(pUVar6);
              }
              goto LAB_0029ee24;
            }
            (*(pUVar6->super_Replaceable).super_UObject._vptr_UObject[1])(pUVar6);
          }
          *status = U_MEMORY_ALLOCATION_ERROR;
        }
LAB_0029ee24:
      } while ((iVar2 == 0) || (iVar2 == 3));
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))(plVar4);
      }
    }
    umtx_unlock_63((UMutex *)lock);
    if (U_ZERO_ERROR < *status) {
      UVector::removeAllElements(result);
    }
  }
  return result;
}

Assistant:

UVector& 
ICUService::getVisibleIDs(UVector& result, const UnicodeString* matchID, UErrorCode& status) const 
{
    result.removeAllElements();

    if (U_FAILURE(status)) {
        return result;
    }

    {
        Mutex mutex(&lock);
        const Hashtable* map = getVisibleIDMap(status);
        if (map != NULL) {
            ICUServiceKey* fallbackKey = createKey(matchID, status);

            for (int32_t pos = UHASH_FIRST;;) {
                const UHashElement* e = map->nextElement(pos);
                if (e == NULL) {
                    break;
                }

                const UnicodeString* id = (const UnicodeString*)e->key.pointer;
                if (fallbackKey != NULL) {
                    if (!fallbackKey->isFallbackOf(*id)) {
                        continue;
                    }
                }

                UnicodeString* idClone = new UnicodeString(*id);
                if (idClone == NULL || idClone->isBogus()) {
                    delete idClone;
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }
                result.addElement(idClone, status);
                if (U_FAILURE(status)) {
                    delete idClone;
                    break;
                }
            }
            delete fallbackKey;
        }
    }
    if (U_FAILURE(status)) {
        result.removeAllElements();
    }
    return result;
}